

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int archive_read_open1(archive *_a)

{
  archive_string_conv **ppaVar1;
  long lVar2;
  size_t sVar3;
  undefined8 *puVar4;
  archive_read_filter *filter;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  archive_string_conv **ppaVar10;
  size_t sVar11;
  char *pcVar12;
  archive_read_filter_bidder *best_bidder;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ssize_t avail;
  long local_38;
  
  iVar7 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar7 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].error == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
LAB_00102df3:
    _a->state = 0x8000;
    iVar17 = -0x1e;
  }
  else {
    if ((*(code **)&_a[1].file_count != (code *)0x0) &&
       (iVar7 = (**(code **)&_a[1].file_count)(_a,*(undefined8 *)(_a[1].read_data_block + 0x10)),
       iVar7 != 0)) {
      read_client_close_proxy((archive_read *)_a);
      return iVar7;
    }
    pvVar9 = calloc(1,0x90);
    if (pvVar9 == (void *)0x0) {
      return -0x1e;
    }
    *(undefined8 *)((long)pvVar9 + 8) = 0;
    *(undefined8 *)((long)pvVar9 + 0x10) = 0;
    *(archive **)((long)pvVar9 + 0x18) = _a;
    pcVar12 = _a[1].read_data_block;
    *(undefined8 *)((long)pvVar9 + 0x28) = *(undefined8 *)(pcVar12 + 0x10);
    *(archive_read_filter_vtable **)((long)pvVar9 + 0x20) = &none_reader_vtable;
    *(char **)((long)pvVar9 + 0x30) = "none";
    *(undefined8 *)((long)pvVar9 + 0x38) = 0x100000000;
    *(undefined4 *)((long)pvVar9 + 0x40) = 1;
    pcVar12[0] = '\0';
    pcVar12[1] = '\0';
    pcVar12[2] = '\0';
    pcVar12[3] = '\0';
    pcVar12[4] = '\0';
    pcVar12[5] = '\0';
    pcVar12[6] = '\0';
    pcVar12[7] = '\0';
    sVar3 = _a[4].error_string.length;
    if ((sVar3 == 0) || ((int)_a[4].error_string.buffer_length == 0)) {
      _a[4].error_string.length = (size_t)pvVar9;
      iVar7 = 0;
      do {
        lVar16 = 0;
        lVar13 = 0;
        iVar17 = 0;
        do {
          puVar4 = *(undefined8 **)((long)&_a[1].read_data_remaining + lVar16);
          if (puVar4 != (undefined8 *)0x0) {
            lVar2 = (long)&_a[1].read_data_offset + lVar16;
            iVar8 = (*(code *)*puVar4)(lVar2,_a[4].error_string.length);
            if (iVar17 < iVar8) {
              lVar13 = lVar2;
              iVar17 = iVar8;
            }
          }
          lVar16 = lVar16 + 0x18;
        } while ((int)lVar16 != 0x180);
        if (lVar13 == 0) {
          __archive_read_filter_ahead((archive_read_filter *)_a[4].error_string.length,1,&local_38);
          bVar5 = false;
          iVar17 = 0;
          if (local_38 < 0) {
            __archive_read_free_filters((archive_read *)_a);
            iVar17 = -0x1e;
            bVar5 = true;
          }
          goto LAB_00102f10;
        }
        pvVar9 = calloc(1,0x90);
        iVar17 = -0x1e;
        bVar5 = true;
        if (pvVar9 == (void *)0x0) goto LAB_00102f10;
        *(long *)((long)pvVar9 + 8) = lVar13;
        *(archive **)((long)pvVar9 + 0x18) = _a;
        *(size_t *)((long)pvVar9 + 0x10) = _a[4].error_string.length;
        _a[4].error_string.length = (size_t)pvVar9;
        iVar8 = (**(code **)(*(long *)(lVar13 + 0x10) + 8))(pvVar9);
        if (iVar8 != 0) {
          __archive_read_free_filters((archive_read *)_a);
          goto LAB_00102f10;
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0x19);
      archive_set_error(_a,0x54,"Input requires too many filters for decoding");
LAB_00102f10:
      if (bVar5) goto LAB_00102df3;
    }
    else {
      do {
        sVar11 = sVar3;
        sVar3 = *(size_t *)(sVar11 + 0x10);
      } while (sVar3 != 0);
      *(void **)(sVar11 + 0x10) = pvVar9;
      iVar17 = 0;
    }
    if (_a[0xe].error_string.length == 0) {
      ppaVar1 = &_a[4].sconv;
      _a[0xe].error_string.length = (size_t)ppaVar1;
      uVar14 = 0;
      uVar15 = 0xffffffff;
      iVar7 = -1;
      ppaVar10 = ppaVar1;
      do {
        iVar8 = iVar7;
        uVar6 = uVar15;
        if (ppaVar10[2] != (archive_string_conv *)0x0) {
          iVar8 = (*(code *)ppaVar10[2])(_a);
          if (iVar8 == -0x1e) goto LAB_00102fd8;
          filter = (archive_read_filter *)_a[4].error_string.length;
          if (filter->position != 0) {
            __archive_read_filter_seek(filter,0,0);
          }
          uVar6 = uVar14;
          if (-1 < (int)uVar15 && iVar8 <= iVar7) {
            iVar8 = iVar7;
            uVar6 = uVar15;
          }
        }
        uVar15 = uVar6;
        iVar7 = iVar8;
        uVar14 = uVar14 + 1;
        ppaVar10 = (archive_string_conv **)(_a[0xe].error_string.length + 0x58);
        _a[0xe].error_string.length = (size_t)ppaVar10;
      } while (uVar14 != 0x10);
      if ((int)uVar15 < 0) {
        pcVar12 = "No formats registered";
LAB_00102fc9:
        archive_set_error(_a,0x54,pcVar12);
LAB_00102fd8:
        uVar15 = 0xffffffe2;
      }
      else if (iVar7 < 1) {
        pcVar12 = "Unrecognized archive format";
        goto LAB_00102fc9;
      }
      if ((int)uVar15 < 0) {
        close_filters((archive_read *)_a);
        goto LAB_00102df3;
      }
      _a[0xe].error_string.length = (size_t)(ppaVar1 + (ulong)uVar15 * 0xb);
    }
    _a->state = 2;
    client_switch_proxy((archive_read_filter *)_a[4].error_string.length,0);
  }
  return iVar17;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			read_client_close_proxy(a);
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->vtable = &none_reader_vtable;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;
	filter->can_skip = 1;
	filter->can_seek = 1;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}